

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

Matrix44<double> * __thiscall
Imath_3_2::Matrix44<double>::translate<float>(Matrix44<double> *this,Vec3<float> *t)

{
  Vec3<float> *t_local;
  Matrix44<double> *this_local;
  
  this->x[3][0] =
       (double)t->z * this->x[2][0] + (double)t->x * this->x[0][0] + (double)t->y * this->x[1][0] +
       this->x[3][0];
  this->x[3][1] =
       (double)t->z * this->x[2][1] + (double)t->x * this->x[0][1] + (double)t->y * this->x[1][1] +
       this->x[3][1];
  this->x[3][2] =
       (double)t->z * this->x[2][2] + (double)t->x * this->x[0][2] + (double)t->y * this->x[1][2] +
       this->x[3][2];
  this->x[3][3] =
       (double)t->z * this->x[2][3] + (double)t->x * this->x[0][3] + (double)t->y * this->x[1][3] +
       this->x[3][3];
  return this;
}

Assistant:

const Matrix44<T>&
                 Matrix44<T>::translate (const Vec3<S>& t) IMATH_NOEXCEPT
{
    x[3][0] += t.x * x[0][0] + t.y * x[1][0] + t.z * x[2][0];
    x[3][1] += t.x * x[0][1] + t.y * x[1][1] + t.z * x[2][1];
    x[3][2] += t.x * x[0][2] + t.y * x[1][2] + t.z * x[2][2];
    x[3][3] += t.x * x[0][3] + t.y * x[1][3] + t.z * x[2][3];

    return *this;
}